

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.h
# Opt level: O0

uint64_t pbrt::Hash<void*>(void *args)

{
  uint64_t uVar1;
  uint64_t buf [1];
  size_t n;
  size_t sz;
  void *in_stack_ffffffffffffffd8;
  char *in_stack_ffffffffffffffe0;
  
  hashRecursiveCopy<void*>(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  uVar1 = MurmurHash64A(&stack0xffffffffffffffe0,8,0);
  return uVar1;
}

Assistant:

PBRT_CPU_GPU inline uint64_t Hash(Args... args) {
    // C++, you never cease to amaze: https://stackoverflow.com/a/57246704
    constexpr size_t sz = (sizeof(Args) + ... + 0);
    constexpr size_t n = (sz + 7) / 8;
    uint64_t buf[n];
    hashRecursiveCopy((char *)buf, args...);
    return MurmurHash64A((const unsigned char *)buf, sz, 0);
}